

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstCastTestT<long>(void)

{
  int iVar1;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> this;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffe80;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_8;
  
  if (ConstCastTestT<long>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::b);
    if (iVar1 != 0) {
      local_8 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::b = ::SafeInt::operator_cast_to_bool((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::b);
    }
  }
  if (ConstCastTestT<long>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::w);
    if (iVar1 != 0) {
      local_20 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::w = ::SafeInt::operator_cast_to_wchar_t(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::w);
    }
  }
  if (ConstCastTestT<long>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::c);
    if (iVar1 != 0) {
      local_28 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::c = ::SafeInt::operator_cast_to_char(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::c);
    }
  }
  if (ConstCastTestT<long>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::sc);
    if (iVar1 != 0) {
      local_30 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::sc = ::SafeInt::operator_cast_to_signed_char(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::sc);
    }
  }
  if (ConstCastTestT<long>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::uc);
    if (iVar1 != 0) {
      local_38 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::uc =
           ::SafeInt::operator_cast_to_unsigned_char(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::uc);
    }
  }
  if (ConstCastTestT<long>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::s);
    if (iVar1 != 0) {
      local_40 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::s = ::SafeInt::operator_cast_to_short(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::s);
    }
  }
  if (ConstCastTestT<long>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::us);
    if (iVar1 != 0) {
      local_48 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::us =
           ::SafeInt::operator_cast_to_unsigned_short(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::us);
    }
  }
  if (ConstCastTestT<long>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::i);
    if (iVar1 != 0) {
      local_50 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::i = ::SafeInt::operator_cast_to_int(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::i);
    }
  }
  if (ConstCastTestT<long>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::ui);
    if (iVar1 != 0) {
      local_58 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::ui = ::SafeInt::operator_cast_to_unsigned_int(in_stack_fffffffffffffe80)
      ;
      __cxa_guard_release(&ConstCastTestT<long>()::ui);
    }
  }
  if (ConstCastTestT<long>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::l);
    if (iVar1 != 0) {
      local_60 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::l = ::SafeInt::operator_cast_to_long(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::l);
    }
  }
  if (ConstCastTestT<long>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::ul);
    if (iVar1 != 0) {
      local_68 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::ul =
           ::SafeInt::operator_cast_to_unsigned_long(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::ul);
    }
  }
  if (ConstCastTestT<long>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::ll);
    if (iVar1 != 0) {
      local_70 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::ll = ::SafeInt::operator_cast_to_long_long(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::ll);
    }
  }
  if (ConstCastTestT<long>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::ull);
    if (iVar1 != 0) {
      local_78 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::ull =
           ::SafeInt::operator_cast_to_unsigned_long_long(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::ull);
    }
  }
  if (ConstCastTestT<long>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::st);
    if (iVar1 != 0) {
      local_80 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::st =
           ::SafeInt::operator_cast_to_unsigned_long(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::st);
    }
  }
  if (ConstCastTestT<long>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::pt);
    if (iVar1 != 0) {
      local_88 = (long)ConstSafeInt<long>();
      ConstCastTestT<long>::pt = ::SafeInt::operator_cast_to_long(in_stack_fffffffffffffe80);
      __cxa_guard_release(&ConstCastTestT<long>()::pt);
    }
  }
  if (ConstCastTestT<long>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::pl);
    if (iVar1 != 0) {
      this = ConstSafeInt<long>();
      local_90 = this;
      SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      operator+(&local_90);
      ConstCastTestT<long>::pl =
           ::SafeInt::operator_cast_to_int
                     ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                       *)this.m_int);
      __cxa_guard_release(&ConstCastTestT<long>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}